

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ignore.cpp
# Opt level: O0

void f(int *i,int j)

{
  ostream *poVar1;
  int in_ESI;
  int *in_RDI;
  rep_conflict rVar2;
  scoped_lock l_2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_fffffffffffffeb8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffec0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffec8;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffed0;
  duration<double,_std::ratio<1L,_1L>_> local_70 [2];
  undefined8 local_60;
  rep local_58;
  duration<double,_std::ratio<1L,_1L>_> local_50 [2];
  undefined8 local_40;
  rep local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30 [4];
  int local_c;
  int *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f begin: ");
  local_40 = std::chrono::_V2::system_clock::now();
  local_38 = (rep)std::chrono::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  poVar1 = std::operator<<(poVar1," j=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x12279f);
  mywait((float)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f comes back at: ");
  local_60 = std::chrono::_V2::system_clock::now();
  local_58 = (rep)std::chrono::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_50);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  poVar1 = std::operator<<(poVar1," j=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1228db);
  do {
  } while (*local_8 != 3);
  *local_8 = *local_8 + local_c;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"f finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_70);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  poVar1 = std::operator<<(poVar1," j=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x122a78);
  return;
}

Assistant:

void f(volatile int &i, int j) {
  LOG("f begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i << " j=" << j);
  
  mywait(1.5f);
  
  LOG("f comes back at: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i << " j=" << j);
  
  while (i != 3) {
    //g should be able to run before this point of f, and thus let i=3
  }
  
  i += j;
  
  LOG("f finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i << " j=" << j);
}